

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

int __thiscall Path::rename(Path *this,char *__old,char *__new)

{
  Type TVar1;
  Path *extraout_RAX;
  char *__old_00;
  char *__new_00;
  Path *extraout_RAX_00;
  Path *pPVar2;
  Log local_100;
  String local_f0;
  String local_d0;
  Log local_b0;
  Log local_a0;
  int local_90;
  int result;
  Log local_80;
  String local_70;
  String local_50;
  Log local_30;
  String *local_20;
  Path *f_newName_local;
  Path *this_local;
  
  local_20 = (String *)__old;
  f_newName_local = this;
  TVar1 = type(this);
  if (TVar1 != File) {
    TVar1 = type(this);
    if (TVar1 != Directory) {
      ::error();
      Log::operator<<((Log *)&local_70,(char *)&local_80);
      ::operator<<((Log *)&local_70.mString.field_2,&local_70);
      Log::operator<<((Log *)&local_50,local_70.mString.field_2._M_local_buf);
      ::operator<<((Log *)&local_50.mString.field_2,&local_50);
      Log::operator<<(&local_30,local_50.mString.field_2._M_local_buf);
      Log::~Log(&local_30);
      Log::~Log((Log *)&local_50.mString.field_2);
      Log::~Log((Log *)&local_50);
      Log::~Log((Log *)&local_70.mString.field_2);
      Log::~Log((Log *)&local_70);
      Log::~Log(&local_80);
      this_local._7_1_ = 0;
      pPVar2 = extraout_RAX;
      goto LAB_0025211b;
    }
  }
  __old_00 = String::c_str(&this->super_String);
  __new_00 = String::c_str(local_20);
  local_90 = ::rename(__old_00,__new_00);
  if (local_90 == 0) {
    pPVar2 = operator=(this,(Path *)local_20);
    this_local._7_1_ = 1;
  }
  else {
    ::error();
    Log::operator<<((Log *)&local_f0,(char *)&local_100);
    ::operator<<((Log *)&local_f0.mString.field_2,&local_f0);
    Log::operator<<((Log *)&local_d0,local_f0.mString.field_2._M_local_buf);
    ::operator<<((Log *)&local_d0.mString.field_2,&local_d0);
    Log::operator<<(&local_b0,local_d0.mString.field_2._M_local_buf);
    __errno_location();
    Log::operator<<(&local_a0,(int32_t)&local_b0);
    Log::~Log(&local_a0);
    Log::~Log(&local_b0);
    Log::~Log((Log *)&local_d0.mString.field_2);
    Log::~Log((Log *)&local_d0);
    Log::~Log((Log *)&local_f0.mString.field_2);
    Log::~Log((Log *)&local_f0);
    Log::~Log(&local_100);
    this_local._7_1_ = 0;
    pPVar2 = extraout_RAX_00;
  }
LAB_0025211b:
  return (int)CONCAT71((int7)((ulong)pPVar2 >> 8),this_local._7_1_);
}

Assistant:

bool Path::rename(const Path &f_newName)
{
    if(type() != File && type() != Directory)
    {
        error() << "Can't rename " << *this << " to " << f_newName
                << ": Not a file or directory.";
        return false;
    }

#ifdef _WIN32
    if(f_newName.exists())
    {
        // on windows, rename() fails if the target exists.
        f_newName.rm();
    }

    int result = _wrename(Utf8To16(c_str()).asWchar_t(),
                          Utf8To16(f_newName.c_str()).asWchar_t());
#else
    int result = ::rename(c_str(), f_newName.c_str());
#endif

    if(result != 0)
    {
        error() << "Can't rename " << *this << " to " << f_newName
                << ": errno=" << errno;
        return false;
    }

    // rename was successful
    *this = f_newName;

    return true;
}